

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

void __thiscall
JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
          (JointPolicyPureVectorForClusteredBG *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *pu,PolicyDomainCategory idc,
          JPPVfCBG_constPtr *prevJPolBG,double r)

{
  bool bVar1;
  undefined8 uVar2;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  BGwCI_constPtr bg;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> *in_stack_ffffffffffffff68;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_ffffffffffffff70;
  shared_ptr<const_BayesianGameWithClusterInfo> *r_00;
  size_t in_stack_ffffffffffffff80;
  shared_ptr<const_BayesianGameWithClusterInfo> *this_00;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *pu_00;
  PartialJointPolicyPureVector *in_stack_ffffffffffffffa0;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_38 [2];
  int local_14;
  
  pu_00 = local_38;
  local_14 = in_EDX;
  boost::shared_ptr<Interface_ProblemToPolicyDiscretePure_const>::
  shared_ptr<BayesianGameIdenticalPayoffInterface_const>(pu_00,in_RSI);
  PartialJointPolicyPureVector::PartialJointPolicyPureVector
            (in_stack_ffffffffffffffa0,pu_00,(PolicyDomainCategory)((ulong)in_RDI >> 0x20),
             (double)in_RCX,in_stack_ffffffffffffff80);
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x8c7b3a);
  *in_RDI = &PTR_operator__00d06ce0;
  in_RDI[8] = &DAT_00d06dc8;
  r_00 = (shared_ptr<const_BayesianGameWithClusterInfo> *)(in_RDI + 0x11);
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c7b6f);
  this_00 = (shared_ptr<const_BayesianGameWithClusterInfo> *)(in_RDI + 0x13);
  boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::shared_ptr
            ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  if (local_14 != 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E((E *)in_stack_ffffffffffffffa0,(char *)pu_00);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  boost::
  dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
            (in_RCX);
  bVar1 = boost::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (!bVar1) {
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(this_00,r_00);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c7cd2);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  E::E((E *)in_stack_ffffffffffffffa0,(char *)pu_00);
  __cxa_throw(uVar2,&E::typeinfo,E::~E);
}

Assistant:

JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG(
        const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &pu,
        PolicyGlobals::PolicyDomainCategory idc,
        JPPVfCBG_constPtr prevJPolBG,
        double r)
    : 
    PartialJointPolicyPureVector( pu, PolicyGlobals::TYPE_INDEX, r ),
    _m_bg(),
    _m_prevJPolBG(prevJPolBG)
{
    if(idc!=PolicyGlobals::TYPE_INDEX)
        throw(E("JointPolicyPureVectorForClusteredBG should have TYPE_INDEX as domain category"));

    BGwCI_constPtr bg = boost::dynamic_pointer_cast<const BayesianGameWithClusterInfo>(pu);
    if(bg==0)
        throw(E("JointPolicyPureVectorForClusteredBG can only be constructed with a BayesianGameWithClusterInfo"));
    _m_bg=bg;
}